

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int uv_tcp_listen(uv_tcp_t *tcp,int backlog,uv_connection_cb cb)

{
  int iVar1;
  int *piVar2;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  char *val;
  int err;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  uv_loop_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if (*(int *)(in_RDI + 0xd0) == 0) {
    if (uv_tcp_listen::single_accept == -1) {
      in_stack_ffffffffffffffd0 = (uv_loop_t *)getenv("UV_TCP_SINGLE_ACCEPT");
      in_stack_ffffffffffffffcf = false;
      if (in_stack_ffffffffffffffd0 != (uv_loop_t *)0x0) {
        iVar1 = atoi((char *)in_stack_ffffffffffffffd0);
        in_stack_ffffffffffffffcf = iVar1 != 0;
      }
      uv_tcp_listen::single_accept = (int)(byte)in_stack_ffffffffffffffcf;
    }
    if (uv_tcp_listen::single_accept != 0) {
      *(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) | 0x1000;
    }
    local_4 = maybe_new_socket((uv_tcp_t *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                               (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                               (int)in_stack_ffffffffffffffd0);
    if (local_4 == 0) {
      iVar1 = listen(*(int *)(in_RDI + 0xa0),in_ESI);
      if (iVar1 == 0) {
        *(undefined8 *)(in_RDI + 200) = in_RDX;
        *(code **)(in_RDI + 0x70) = uv__server_io;
        uv__io_start(in_stack_ffffffffffffffd0,
                     (uv__io_t *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
        local_4 = 0;
      }
      else {
        piVar2 = __errno_location();
        local_4 = -*piVar2;
      }
    }
  }
  else {
    local_4 = *(int *)(in_RDI + 0xd0);
  }
  return local_4;
}

Assistant:

int uv_tcp_listen(uv_tcp_t* tcp, int backlog, uv_connection_cb cb) {
  static int single_accept = -1;
  int err;

  if (tcp->delayed_error)
    return tcp->delayed_error;

  if (single_accept == -1) {
    const char* val = getenv("UV_TCP_SINGLE_ACCEPT");
    single_accept = (val != NULL && atoi(val) != 0);  /* Off by default. */
  }

  if (single_accept)
    tcp->flags |= UV_TCP_SINGLE_ACCEPT;

  err = maybe_new_socket(tcp, AF_INET, UV_STREAM_READABLE);
  if (err)
    return err;

  if (listen(tcp->io_watcher.fd, backlog))
    return -errno;

  tcp->connection_cb = cb;

  /* Start listening for connections. */
  tcp->io_watcher.cb = uv__server_io;
  uv__io_start(tcp->loop, &tcp->io_watcher, UV__POLLIN);

  return 0;
}